

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O0

void __thiscall
Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
          (VariableSizeAllocationsManager *this,VariableSizeAllocationsManager *rhs)

{
  VariableSizeAllocationsManager *rhs_local;
  VariableSizeAllocationsManager *this_local;
  
  std::
  map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
  ::map(&this->m_FreeBlocksByOffset,&rhs->m_FreeBlocksByOffset);
  std::
  multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
  ::multimap(&this->m_FreeBlocksBySize,&rhs->m_FreeBlocksBySize);
  this->m_MaxSize = rhs->m_MaxSize;
  this->m_FreeSize = rhs->m_FreeSize;
  this->m_CurrAlignment = rhs->m_CurrAlignment;
  this->m_DbgDisableDebugValidation = (bool)(rhs->m_DbgDisableDebugValidation & 1);
  rhs->m_MaxSize = 0;
  rhs->m_FreeSize = 0;
  rhs->m_CurrAlignment = 0;
  return;
}

Assistant:

VariableSizeAllocationsManager(VariableSizeAllocationsManager&& rhs) noexcept
        : m_FreeBlocksByOffset{std::move(rhs.m_FreeBlocksByOffset)}
        , m_FreeBlocksBySize  {std::move(rhs.m_FreeBlocksBySize)  }
        , m_MaxSize           {rhs.m_MaxSize      }
        , m_FreeSize          {rhs.m_FreeSize     }
        , m_CurrAlignment     {rhs.m_CurrAlignment}
#ifdef DILIGENT_DEBUG
        , m_DbgDisableDebugValidation{rhs.m_DbgDisableDebugValidation}
#endif
    {
        // clang-format on
        rhs.m_MaxSize       = 0;
        rhs.m_FreeSize      = 0;
        rhs.m_CurrAlignment = 0;
    }